

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2c8643::ReferenceType::printLeft(ReferenceType *this,OutputStream *s)

{
  char *pcVar1;
  bool bVar2;
  Node *this_00;
  pair<(anonymous_namespace)::ReferenceKind,_const_(anonymous_namespace)::Node_*> pVar3;
  StringView R;
  StringView R_00;
  StringView R_01;
  
  if (this->Printing == false) {
    this->Printing = true;
    pVar3 = collapse(this,s);
    this_00 = pVar3.second;
    (*this_00->_vptr_Node[4])(this_00,s);
    bVar2 = Node::hasArray(this_00,s);
    if (bVar2) {
      R.Last = "";
      R.First = " ";
      OutputStream::operator+=(s,R);
    }
    bVar2 = Node::hasArray(this_00,s);
    if ((bVar2) || (bVar2 = Node::hasFunction(this_00,s), bVar2)) {
      R_00.Last = "";
      R_00.First = "(";
      OutputStream::operator+=(s,R_00);
    }
    bVar2 = pVar3.first == LValue;
    pcVar1 = " &&";
    if (bVar2) {
      pcVar1 = " &";
    }
    R_01.First = pcVar1 + 1;
    R_01.Last = R_01.First + (2 - (ulong)bVar2);
    OutputStream::operator+=(s,R_01);
    this->Printing = false;
    return;
  }
  return;
}

Assistant:

void printLeft(OutputStream &s) const override {
    if (Printing)
      return;
    SwapAndRestore<bool> SavePrinting(Printing, true);
    std::pair<ReferenceKind, const Node *> Collapsed = collapse(s);
    Collapsed.second->printLeft(s);
    if (Collapsed.second->hasArray(s))
      s += " ";
    if (Collapsed.second->hasArray(s) || Collapsed.second->hasFunction(s))
      s += "(";

    s += (Collapsed.first == ReferenceKind::LValue ? "&" : "&&");
  }